

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O1

void __thiscall Liby::UdpSocket::destroy(UdpSocket *this)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  if (this->destroy_ == false) {
    this->destroy_ = true;
    p_Var1 = (this->acceptorCallback_).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->acceptorCallback_,(_Any_data *)&this->acceptorCallback_,
                __destroy_functor);
      (this->acceptorCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->acceptorCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    p_Var1 = (this->readEventCallback_).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->readEventCallback_,(_Any_data *)&this->readEventCallback_,
                __destroy_functor);
      (this->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    p_Var1 = (this->erroEventCallback_).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->erroEventCallback_,(_Any_data *)&this->erroEventCallback_,
                __destroy_functor);
      (this->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
    }
    std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::clear(&this->writTasks_);
    std::
    _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
    ::clear(&(this->conns_)._M_t);
    p_Var2 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
              ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&this->chan_,
               (pointer)0x0);
    p_Var2 = (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      return;
    }
  }
  return;
}

Assistant:

void UdpSocket::destroy() {
    if (destroy_)
        return;

    destroy_ = true;
    acceptorCallback_ = nullptr;
    readEventCallback_ = nullptr;
    erroEventCallback_ = nullptr;
    writTasks_.clear();
    conns_.clear();
    socket_.reset();
    chan_.reset();
    self_.reset();
}